

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::IntersectEdges(Clipper *this,TEdge *e1,TEdge *e2,IntPoint *Pt)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  long local_60;
  cInt e2Wc2;
  cInt e1Wc2;
  cInt e2Wc;
  cInt e1Wc;
  PolyFillType e2FillType2;
  PolyFillType e1FillType2;
  PolyFillType e2FillType;
  PolyFillType e1FillType;
  int oldE1WindCnt;
  bool e2Contributing;
  bool e1Contributing;
  IntPoint *Pt_local;
  TEdge *e2_local;
  TEdge *e1_local;
  Clipper *this_local;
  
  bVar3 = -1 < e1->OutIdx;
  bVar4 = -1 < e2->OutIdx;
  if ((e1->WindDelta == 0) || (e2->WindDelta == 0)) {
    if ((e1->WindDelta != 0) || (e2->WindDelta != 0)) {
      if (((e1->PolyTyp == e2->PolyTyp) && (e1->WindDelta != e2->WindDelta)) &&
         (this->m_ClipType == ctUnion)) {
        if (e1->WindDelta == 0) {
          if ((bVar4) && (AddOutPt(this,e1,Pt), bVar3)) {
            e1->OutIdx = -1;
          }
        }
        else if ((bVar3) && (AddOutPt(this,e2,Pt), bVar4)) {
          e2->OutIdx = -1;
        }
      }
      else if (e1->PolyTyp != e2->PolyTyp) {
        if (e1->WindDelta == 0) {
          iVar2 = e2->WindCnt;
          if (iVar2 < 1) {
            iVar2 = -iVar2;
          }
          if ((iVar2 == 1) && ((this->m_ClipType != ctUnion || (e2->WindCnt2 == 0)))) {
            AddOutPt(this,e1,Pt);
            if (!bVar3) {
              return;
            }
            e1->OutIdx = -1;
            return;
          }
        }
        if (e2->WindDelta == 0) {
          iVar2 = e1->WindCnt;
          if (iVar2 < 1) {
            iVar2 = -iVar2;
          }
          if (((iVar2 == 1) && ((this->m_ClipType != ctUnion || (e1->WindCnt2 == 0)))) &&
             (AddOutPt(this,e2,Pt), bVar4)) {
            e2->OutIdx = -1;
          }
        }
      }
    }
  }
  else {
    if (e1->PolyTyp == e2->PolyTyp) {
      bVar1 = IsEvenOddFillType(this,e1);
      if (bVar1) {
        iVar2 = e1->WindCnt;
        e1->WindCnt = e2->WindCnt;
        e2->WindCnt = iVar2;
      }
      else {
        if (e1->WindCnt + e2->WindDelta == 0) {
          e1->WindCnt = -e1->WindCnt;
        }
        else {
          e1->WindCnt = e2->WindDelta + e1->WindCnt;
        }
        if (e2->WindCnt == e1->WindDelta) {
          e2->WindCnt = -e2->WindCnt;
        }
        else {
          e2->WindCnt = e2->WindCnt - e1->WindDelta;
        }
      }
    }
    else {
      bVar1 = IsEvenOddFillType(this,e2);
      if (bVar1) {
        e1->WindCnt2 = (uint)(e1->WindCnt2 == 0);
      }
      else {
        e1->WindCnt2 = e2->WindDelta + e1->WindCnt2;
      }
      bVar1 = IsEvenOddFillType(this,e1);
      if (bVar1) {
        e2->WindCnt2 = (uint)(e2->WindCnt2 == 0);
      }
      else {
        e2->WindCnt2 = e2->WindCnt2 - e1->WindDelta;
      }
    }
    if (e1->PolyTyp == ptSubject) {
      e1FillType2 = this->m_SubjFillType;
      e1Wc._4_4_ = this->m_ClipFillType;
    }
    else {
      e1FillType2 = this->m_ClipFillType;
      e1Wc._4_4_ = this->m_SubjFillType;
    }
    if (e2->PolyTyp == ptSubject) {
      e2FillType2 = this->m_SubjFillType;
      e1Wc._0_4_ = this->m_ClipFillType;
    }
    else {
      e2FillType2 = this->m_ClipFillType;
      e1Wc._0_4_ = this->m_SubjFillType;
    }
    if (e1FillType2 == pftPositive) {
      e2Wc = (cInt)e1->WindCnt;
    }
    else if (e1FillType2 == pftNegative) {
      e2Wc = (cInt)-e1->WindCnt;
    }
    else {
      e2Wc = Abs((long)e1->WindCnt);
    }
    if (e2FillType2 == pftPositive) {
      e1Wc2 = (cInt)e2->WindCnt;
    }
    else if (e2FillType2 == pftNegative) {
      e1Wc2 = (cInt)-e2->WindCnt;
    }
    else {
      e1Wc2 = Abs((long)e2->WindCnt);
    }
    if ((bVar3) && (bVar4)) {
      if ((((e2Wc == 0) || (e2Wc == 1)) && ((e1Wc2 == 0 || (e1Wc2 == 1)))) &&
         ((e1->PolyTyp == e2->PolyTyp || (this->m_ClipType == ctXor)))) {
        AddOutPt(this,e1,Pt);
        AddOutPt(this,e2,Pt);
        SwapSides(e1,e2);
        SwapPolyIndexes(e1,e2);
      }
      else {
        AddLocalMaxPoly(this,e1,e2,Pt);
      }
    }
    else if (bVar3) {
      if ((e1Wc2 == 0) || (e1Wc2 == 1)) {
        AddOutPt(this,e1,Pt);
        SwapSides(e1,e2);
        SwapPolyIndexes(e1,e2);
      }
    }
    else if (bVar4) {
      if ((e2Wc == 0) || (e2Wc == 1)) {
        AddOutPt(this,e2,Pt);
        SwapSides(e1,e2);
        SwapPolyIndexes(e1,e2);
      }
    }
    else if (((e2Wc == 0) || (e2Wc == 1)) && ((e1Wc2 == 0 || (e1Wc2 == 1)))) {
      if (e1Wc._4_4_ == pftPositive) {
        e2Wc2 = (cInt)e1->WindCnt2;
      }
      else if (e1Wc._4_4_ == pftNegative) {
        e2Wc2 = (cInt)-e1->WindCnt2;
      }
      else {
        e2Wc2 = Abs((long)e1->WindCnt2);
      }
      if ((PolyFillType)e1Wc == pftPositive) {
        local_60 = (long)e2->WindCnt2;
      }
      else if ((PolyFillType)e1Wc == pftNegative) {
        local_60 = (long)-e2->WindCnt2;
      }
      else {
        local_60 = Abs((long)e2->WindCnt2);
      }
      if (e1->PolyTyp == e2->PolyTyp) {
        if ((e2Wc == 1) && (e1Wc2 == 1)) {
          switch(this->m_ClipType) {
          case ctIntersection:
            if ((0 < e2Wc2) && (0 < local_60)) {
              AddLocalMinPoly(this,e1,e2,Pt);
            }
            break;
          case ctUnion:
            if ((e2Wc2 < 1) && (local_60 < 1)) {
              AddLocalMinPoly(this,e1,e2,Pt);
            }
            break;
          case ctDifference:
            if ((((e1->PolyTyp == ptClip) && (0 < e2Wc2)) && (0 < local_60)) ||
               (((e1->PolyTyp == ptSubject && (e2Wc2 < 1)) && (local_60 < 1)))) {
              AddLocalMinPoly(this,e1,e2,Pt);
            }
            break;
          case ctXor:
            AddLocalMinPoly(this,e1,e2,Pt);
          }
        }
        else {
          SwapSides(e1,e2);
        }
      }
      else {
        AddLocalMinPoly(this,e1,e2,Pt);
      }
    }
  }
  return;
}

Assistant:

void Clipper::IntersectEdges(TEdge *e1, TEdge *e2, IntPoint &Pt)
{
  bool e1Contributing = ( e1->OutIdx >= 0 );
  bool e2Contributing = ( e2->OutIdx >= 0 );

#ifdef use_xyz
        SetZ(Pt, *e1, *e2);
#endif

#ifdef use_lines
  //if either edge is on an OPEN path ...
  if (e1->WindDelta == 0 || e2->WindDelta == 0)
  {
    //ignore subject-subject open path intersections UNLESS they
    //are both open paths, AND they are both 'contributing maximas' ...
	if (e1->WindDelta == 0 && e2->WindDelta == 0) return;

    //if intersecting a subj line with a subj poly ...
    else if (e1->PolyTyp == e2->PolyTyp && 
      e1->WindDelta != e2->WindDelta && m_ClipType == ctUnion)
    {
      if (e1->WindDelta == 0)
      {
        if (e2Contributing)
        {
          AddOutPt(e1, Pt);
          if (e1Contributing) e1->OutIdx = Unassigned;
        }
      }
      else
      {
        if (e1Contributing)
        {
          AddOutPt(e2, Pt);
          if (e2Contributing) e2->OutIdx = Unassigned;
        }
      }
    }
    else if (e1->PolyTyp != e2->PolyTyp)
    {
      //toggle subj open path OutIdx on/off when Abs(clip.WndCnt) == 1 ...
      if ((e1->WindDelta == 0) && abs(e2->WindCnt) == 1 && 
        (m_ClipType != ctUnion || e2->WindCnt2 == 0))
      {
        AddOutPt(e1, Pt);
        if (e1Contributing) e1->OutIdx = Unassigned;
      }
      else if ((e2->WindDelta == 0) && (abs(e1->WindCnt) == 1) && 
        (m_ClipType != ctUnion || e1->WindCnt2 == 0))
      {
        AddOutPt(e2, Pt);
        if (e2Contributing) e2->OutIdx = Unassigned;
      }
    }
    return;
  }
#endif

  //update winding counts...
  //assumes that e1 will be to the Right of e2 ABOVE the intersection
  if ( e1->PolyTyp == e2->PolyTyp )
  {
    if ( IsEvenOddFillType( *e1) )
    {
      int oldE1WindCnt = e1->WindCnt;
      e1->WindCnt = e2->WindCnt;
      e2->WindCnt = oldE1WindCnt;
    } else
    {
      if (e1->WindCnt + e2->WindDelta == 0 ) e1->WindCnt = -e1->WindCnt;
      else e1->WindCnt += e2->WindDelta;
      if ( e2->WindCnt - e1->WindDelta == 0 ) e2->WindCnt = -e2->WindCnt;
      else e2->WindCnt -= e1->WindDelta;
    }
  } else
  {
    if (!IsEvenOddFillType(*e2)) e1->WindCnt2 += e2->WindDelta;
    else e1->WindCnt2 = ( e1->WindCnt2 == 0 ) ? 1 : 0;
    if (!IsEvenOddFillType(*e1)) e2->WindCnt2 -= e1->WindDelta;
    else e2->WindCnt2 = ( e2->WindCnt2 == 0 ) ? 1 : 0;
  }

  PolyFillType e1FillType, e2FillType, e1FillType2, e2FillType2;
  if (e1->PolyTyp == ptSubject)
  {
    e1FillType = m_SubjFillType;
    e1FillType2 = m_ClipFillType;
  } else
  {
    e1FillType = m_ClipFillType;
    e1FillType2 = m_SubjFillType;
  }
  if (e2->PolyTyp == ptSubject)
  {
    e2FillType = m_SubjFillType;
    e2FillType2 = m_ClipFillType;
  } else
  {
    e2FillType = m_ClipFillType;
    e2FillType2 = m_SubjFillType;
  }

  cInt e1Wc, e2Wc;
  switch (e1FillType)
  {
    case pftPositive: e1Wc = e1->WindCnt; break;
    case pftNegative: e1Wc = -e1->WindCnt; break;
    default: e1Wc = Abs(e1->WindCnt);
  }
  switch(e2FillType)
  {
    case pftPositive: e2Wc = e2->WindCnt; break;
    case pftNegative: e2Wc = -e2->WindCnt; break;
    default: e2Wc = Abs(e2->WindCnt);
  }

  if ( e1Contributing && e2Contributing )
  {
    if ((e1Wc != 0 && e1Wc != 1) || (e2Wc != 0 && e2Wc != 1) ||
      (e1->PolyTyp != e2->PolyTyp && m_ClipType != ctXor) )
    {
      AddLocalMaxPoly(e1, e2, Pt); 
    }
    else
    {
      AddOutPt(e1, Pt);
      AddOutPt(e2, Pt);
      SwapSides( *e1 , *e2 );
      SwapPolyIndexes( *e1 , *e2 );
    }
  }
  else if ( e1Contributing )
  {
    if (e2Wc == 0 || e2Wc == 1) 
    {
      AddOutPt(e1, Pt);
      SwapSides(*e1, *e2);
      SwapPolyIndexes(*e1, *e2);
    }
  }
  else if ( e2Contributing )
  {
    if (e1Wc == 0 || e1Wc == 1) 
    {
      AddOutPt(e2, Pt);
      SwapSides(*e1, *e2);
      SwapPolyIndexes(*e1, *e2);
    }
  } 
  else if ( (e1Wc == 0 || e1Wc == 1) && (e2Wc == 0 || e2Wc == 1))
  {
    //neither edge is currently contributing ...

    cInt e1Wc2, e2Wc2;
    switch (e1FillType2)
    {
      case pftPositive: e1Wc2 = e1->WindCnt2; break;
      case pftNegative : e1Wc2 = -e1->WindCnt2; break;
      default: e1Wc2 = Abs(e1->WindCnt2);
    }
    switch (e2FillType2)
    {
      case pftPositive: e2Wc2 = e2->WindCnt2; break;
      case pftNegative: e2Wc2 = -e2->WindCnt2; break;
      default: e2Wc2 = Abs(e2->WindCnt2);
    }

    if (e1->PolyTyp != e2->PolyTyp)
    {
      AddLocalMinPoly(e1, e2, Pt);
    }
    else if (e1Wc == 1 && e2Wc == 1)
      switch( m_ClipType ) {
        case ctIntersection:
          if (e1Wc2 > 0 && e2Wc2 > 0)
            AddLocalMinPoly(e1, e2, Pt);
          break;
        case ctUnion:
          if ( e1Wc2 <= 0 && e2Wc2 <= 0 )
            AddLocalMinPoly(e1, e2, Pt);
          break;
        case ctDifference:
          if (((e1->PolyTyp == ptClip) && (e1Wc2 > 0) && (e2Wc2 > 0)) ||
              ((e1->PolyTyp == ptSubject) && (e1Wc2 <= 0) && (e2Wc2 <= 0)))
                AddLocalMinPoly(e1, e2, Pt);
          break;
        case ctXor:
          AddLocalMinPoly(e1, e2, Pt);
      }
    else
      SwapSides( *e1, *e2 );
  }
}